

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O2

bool __thiscall V4L2Device::open_device(V4L2Device *this)

{
  Options *this_00;
  char *__file;
  int iVar1;
  Writer *pWVar2;
  OptionDetails *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int *piVar4;
  bool bVar5;
  char *local_90;
  char *device;
  Writer local_80;
  
  if (this->fd == -1) {
    this_00 = (this->options).super___shared_ptr<cxxopts::Options,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    std::__cxx11::string::string((string *)&local_80,"device",(allocator *)&local_90);
    this_01 = cxxopts::Options::operator[](this_00,(string *)&local_80);
    pbVar3 = cxxopts::OptionDetails::as<std::__cxx11::string>(this_01);
    __file = (pbVar3->_M_dataplus)._M_p;
    std::__cxx11::string::~string((string *)&local_80);
    device = __file;
    iVar1 = open(__file,2);
    this->fd = iVar1;
    bVar5 = -1 < iVar1;
    if (!bVar5) {
      local_80._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
      local_80.m_level = Error;
      local_80.m_file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
      ;
      local_80.m_line = 0x11f;
      local_80.m_func = "bool V4L2Device::open_device()";
      local_80.m_verboseLevel = 0;
      local_80.m_logger = (Logger *)0x0;
      local_80.m_proceed = false;
      local_80.m_messageBuilder.m_logger = (Logger *)0x0;
      local_80.m_messageBuilder.m_containerLogSeperator = "";
      local_80.m_dispatchAction = NormalLog;
      local_80.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_80.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_80.m_loggerIds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pWVar2 = el::base::Writer::construct(&local_80,1,"default");
      pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [16])"Couldn\'t open \'");
      pWVar2 = el::base::Writer::operator<<(pWVar2,&device);
      pWVar2 = el::base::Writer::operator<<(pWVar2,(char (*) [4])"\': ");
      piVar4 = __errno_location();
      local_90 = strerror(*piVar4);
      el::base::Writer::operator<<(pWVar2,&local_90);
      el::base::Writer::~Writer(&local_80);
    }
  }
  else {
    local_80._vptr_Writer = (_func_int **)&PTR__Writer_00176078;
    local_80.m_level = Warning;
    local_80.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_80.m_line = 0x123;
    local_80.m_func = "bool V4L2Device::open_device()";
    local_80.m_verboseLevel = 0;
    local_80.m_logger = (Logger *)0x0;
    local_80.m_proceed = false;
    local_80.m_messageBuilder.m_logger = (Logger *)0x0;
    local_80.m_messageBuilder.m_containerLogSeperator = "";
    local_80.m_dispatchAction = NormalLog;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar2 = el::base::Writer::construct(&local_80,1,"default");
    el::base::Writer::operator<<(pWVar2,(char (*) [31])"Is device already initialized?");
    el::base::Writer::~Writer(&local_80);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool
    open_device()
    {
        if (fd == -1) {
            auto device = (*options)["device"].as<std::string>().c_str();
            fd = open(device, O_RDWR);
            if (fd < 0) {
                LOG(ERROR) << "Couldn't open '" << device << "': " << strerror(errno);
                return false;
            }
        } else {
            LOG(WARNING) << "Is device already initialized?";
            return false;
        }

        return true;
    }